

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.c
# Opt level: O0

void glad_gl_load_GL_VERSION_1_5(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_VERSION_1_5 != 0) {
    glad_glBeginQuery = (PFNGLBEGINQUERYPROC)(*load)(userptr,"glBeginQuery");
    glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)(userptr,"glBindBuffer");
    glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)(userptr,"glBufferData");
    glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)(userptr,"glBufferSubData");
    glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)(userptr,"glDeleteBuffers");
    glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC)(*load)(userptr,"glDeleteQueries");
    glad_glEndQuery = (PFNGLENDQUERYPROC)(*load)(userptr,"glEndQuery");
    glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)(userptr,"glGenBuffers");
    glad_glGenQueries = (PFNGLGENQUERIESPROC)(*load)(userptr,"glGenQueries");
    glad_glGetBufferParameteriv =
         (PFNGLGETBUFFERPARAMETERIVPROC)(*load)(userptr,"glGetBufferParameteriv");
    glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC)(*load)(userptr,"glGetBufferPointerv");
    glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC)(*load)(userptr,"glGetBufferSubData");
    glad_glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC)(*load)(userptr,"glGetQueryObjectiv");
    glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC)(*load)(userptr,"glGetQueryObjectuiv");
    glad_glGetQueryiv = (PFNGLGETQUERYIVPROC)(*load)(userptr,"glGetQueryiv");
    glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)(userptr,"glIsBuffer");
    glad_glIsQuery = (PFNGLISQUERYPROC)(*load)(userptr,"glIsQuery");
    glad_glMapBuffer = (PFNGLMAPBUFFERPROC)(*load)(userptr,"glMapBuffer");
    glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC)(*load)(userptr,"glUnmapBuffer");
  }
  return;
}

Assistant:

static void glad_gl_load_GL_VERSION_1_5( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_VERSION_1_5) return;
    glad_glBeginQuery = (PFNGLBEGINQUERYPROC) load(userptr, "glBeginQuery");
    glad_glBindBuffer = (PFNGLBINDBUFFERPROC) load(userptr, "glBindBuffer");
    glad_glBufferData = (PFNGLBUFFERDATAPROC) load(userptr, "glBufferData");
    glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC) load(userptr, "glBufferSubData");
    glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC) load(userptr, "glDeleteBuffers");
    glad_glDeleteQueries = (PFNGLDELETEQUERIESPROC) load(userptr, "glDeleteQueries");
    glad_glEndQuery = (PFNGLENDQUERYPROC) load(userptr, "glEndQuery");
    glad_glGenBuffers = (PFNGLGENBUFFERSPROC) load(userptr, "glGenBuffers");
    glad_glGenQueries = (PFNGLGENQUERIESPROC) load(userptr, "glGenQueries");
    glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC) load(userptr, "glGetBufferParameteriv");
    glad_glGetBufferPointerv = (PFNGLGETBUFFERPOINTERVPROC) load(userptr, "glGetBufferPointerv");
    glad_glGetBufferSubData = (PFNGLGETBUFFERSUBDATAPROC) load(userptr, "glGetBufferSubData");
    glad_glGetQueryObjectiv = (PFNGLGETQUERYOBJECTIVPROC) load(userptr, "glGetQueryObjectiv");
    glad_glGetQueryObjectuiv = (PFNGLGETQUERYOBJECTUIVPROC) load(userptr, "glGetQueryObjectuiv");
    glad_glGetQueryiv = (PFNGLGETQUERYIVPROC) load(userptr, "glGetQueryiv");
    glad_glIsBuffer = (PFNGLISBUFFERPROC) load(userptr, "glIsBuffer");
    glad_glIsQuery = (PFNGLISQUERYPROC) load(userptr, "glIsQuery");
    glad_glMapBuffer = (PFNGLMAPBUFFERPROC) load(userptr, "glMapBuffer");
    glad_glUnmapBuffer = (PFNGLUNMAPBUFFERPROC) load(userptr, "glUnmapBuffer");
}